

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImFont_*>::push_back(ImVector<ImFont_*> *this,ImFont **v)

{
  undefined8 *in_RSI;
  ImVector<ImFont_*> *in_RDI;
  ImVector<ImFont_*> *unaff_retaddr;
  ImVector<ImFont_*> *pIVar1;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar1 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar1 >> 0x20));
  }
  in_RDI->Data[in_RDI->Size] = (ImFont *)*in_RSI;
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }